

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteComment(ostream *os,string *comment)

{
  ulong uVar1;
  ostream *poVar2;
  string local_98 [32];
  string local_78 [48];
  long local_48;
  size_type rpos;
  size_type lpos;
  string replace;
  string *comment_local;
  ostream *os_local;
  
  replace.field_2._8_8_ = comment;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&lpos,(string *)replace.field_2._8_8_);
    rpos = 0;
    std::operator<<(os,"\n#############################################\n");
    while (local_48 = std::__cxx11::string::find((char)&lpos,10), local_48 != -1) {
      poVar2 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)local_78,(ulong)&lpos);
      poVar2 = std::operator<<(poVar2,local_78);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_78);
      rpos = local_48 + 1;
    }
    poVar2 = std::operator<<(os,"# ");
    std::__cxx11::string::substr((ulong)local_98,(ulong)&lpos);
    poVar2 = std::operator<<(poVar2,local_98);
    std::operator<<(poVar2,"\n\n");
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&lpos);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteComment(std::ostream& os,
                                          const std::string& comment)
{
  if (comment.empty())
    return;

  std::string replace = comment;
  std::string::size_type lpos = 0;
  std::string::size_type rpos;
  os << "\n#############################################\n";
  while((rpos = replace.find('\n', lpos)) != std::string::npos)
    {
    os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
    lpos = rpos + 1;
    }
  os << "# " << replace.substr(lpos) << "\n\n";
}